

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

int32_t __thiscall llama_kv_cache_unified::get_n_tokens(llama_kv_cache_unified *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 0; (ulong)this->size << 6 != lVar2; lVar2 = lVar2 + 0x40) {
    iVar1 = iVar1 + *(int *)((long)&(((this->cells).
                                      super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->seq_id)._M_t.
                                    _M_impl + lVar2 + 0x28);
  }
  return iVar1;
}

Assistant:

int32_t llama_kv_cache_unified::get_n_tokens() const {
    int32_t result = 0;

    for (uint32_t i = 0; i < size; i++) {
        result += cells[i].seq_id.size();
    }

    return result;
}